

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O2

void __thiscall ModbusAnalyzer::ModbusAnalyzer(ModbusAnalyzer *this)

{
  ModbusAnalyzerSettings *this_00;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__ModbusAnalyzer_00120ca8;
  this_00 = (ModbusAnalyzerSettings *)operator_new(0x78);
  ModbusAnalyzerSettings::ModbusAnalyzerSettings(this_00);
  (this->mSettings)._M_ptr = this_00;
  (this->mResults)._M_ptr = (ModbusAnalyzerResults *)0x0;
  ModbusSimulationDataGenerator::ModbusSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  init_crc16_tab(this);
  return;
}

Assistant:

ModbusAnalyzer::ModbusAnalyzer() : Analyzer2(), mSettings( new ModbusAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );

    // used for calculating Modbus Checksum values
    init_crc16_tab();
}